

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2_cod.c
# Opt level: O1

jp2_box_t * jp2_box_create(int type)

{
  jp2_boxinfo_t *pjVar1;
  jp2_boxinfo_t *boxinfo;
  jp2_box_t *__s;
  jp2_boxinfo_t *pjVar2;
  
  __s = (jp2_box_t *)jas_malloc(0x140);
  if (__s == (jp2_box_t *)0x0) {
    __s = (jp2_box_t *)0x0;
  }
  else {
    memset(__s,0,0x140);
    __s->ops = (jp2_boxops_s *)0x148158;
  }
  if (__s == (jp2_box_t *)0x0) {
    __s = (jp2_box_t *)0x0;
  }
  else {
    __s->type = (long)type;
    __s->len = 0;
    pjVar2 = jp2_boxinfos;
    do {
      if (pjVar2->type == type) goto LAB_00116470;
      pjVar1 = pjVar2 + 1;
      pjVar2 = pjVar2 + 1;
    } while (pjVar1->name != (char *)0x0);
    pjVar2 = &jp2_boxinfo_unk;
LAB_00116470:
    __s->info = pjVar2;
    __s->ops = &pjVar2->ops;
  }
  return __s;
}

Assistant:

jp2_box_t *jp2_box_create(int type)
{
	jp2_box_t *box;
	const jp2_boxinfo_t *boxinfo;
	if (!(box = jp2_box_create0())) {
		return 0;
	}
	box->type = type;
	box->len = 0;
	if (!(boxinfo = jp2_boxinfolookup(type))) {
		return 0;
	}
	box->info = boxinfo;
	box->ops = &boxinfo->ops;
	return box;
}